

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::clear(lzcompressor *this)

{
  undefined4 *puVar1;
  long in_RDI;
  uint j;
  parse_thread_state *parse_state;
  uint i;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint local_c;
  
  lzham::symbol_codec::clear();
  *(undefined8 *)(in_RDI + 0x68) = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 0x70) = 1;
  vector<unsigned_char>::clear
            ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  vector<unsigned_char>::clear
            ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  *(undefined4 *)(in_RDI + 0x3968) = 0;
  *(undefined1 *)(in_RDI + 0x3974) = 0;
  *(undefined1 *)(in_RDI + 0x3975) = 0;
  *(undefined1 *)(in_RDI + 0x3976) = 0;
  *(undefined4 *)(in_RDI + 0x396c) = 0;
  *(undefined4 *)(in_RDI + 0x3970) = 0;
  state::clear((state *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *(undefined4 *)(in_RDI + 0x43ec) = 0;
  *(undefined4 *)(in_RDI + 0x43e8) = 0x80;
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    puVar1 = (undefined4 *)(in_RDI + 0x43f0 + (ulong)local_c * 0x156800);
    state::clear((state *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < 0xc01;
        in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
      node::clear((node *)(puVar1 + (ulong)in_stack_ffffffffffffffe4 * 0x72 + 0x152));
    }
    *puVar1 = 0;
    puVar1[1] = 0;
    vector<lzham::lzcompressor::lzdecision>::clear
              ((vector<lzham::lzcompressor::lzdecision> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    *(undefined1 *)((long)puVar1 + 0x15675d) = 0;
    *(undefined1 *)(puVar1 + 0x559ca) = 0;
    *(undefined1 *)((long)puVar1 + 0x15675e) = 0;
    puVar1[0x559d5] = 0xffffffff;
    puVar1[0x559d6] = 0;
  }
  return;
}

Assistant:

void lzcompressor::clear()
   {
      m_codec.clear();
      m_src_size = -1;
      m_src_adler32 = cInitAdler32;
      m_block_buf.clear();
      m_comp_buf.clear();

      m_step = 0;
      m_finished = false;
      m_use_task_pool = false;
      m_use_extreme_parsing = false;
      m_block_start_dict_ofs = 0;
      m_block_index = 0;
      m_state.clear();
      m_num_parse_threads = 0;
      m_fast_bytes = 128;

      for (uint i = 0; i < cMaxParseThreads; i++)
      {
         parse_thread_state &parse_state = m_parse_thread_state[i];
         parse_state.m_state.clear();

         for (uint j = 0; j <= cMaxParseGraphNodes; j++)
            parse_state.m_nodes[j].clear();

         parse_state.m_start_ofs = 0;
         parse_state.m_bytes_to_match = 0;
         parse_state.m_best_decisions.clear();
         parse_state.m_issue_reset_state_partial = false;
         parse_state.m_emit_decisions_backwards = false;
         parse_state.m_failed = false;
         parse_state.m_parse_early_out_thresh = UINT_MAX;
         parse_state.m_bytes_actually_parsed = 0;
      }
   }